

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pla.h
# Opt level: O0

void Pla_ManPrintStats(Pla_Man_t *p,int fVerbose)

{
  uint uVar1;
  char *pcVar2;
  int fVerbose_local;
  Pla_Man_t *p_local;
  
  pcVar2 = Pla_ManName(p);
  printf("%-16s :  ",pcVar2);
  uVar1 = Pla_ManInNum(p);
  printf("In =%4d  ",(ulong)uVar1);
  uVar1 = Pla_ManOutNum(p);
  printf("Out =%4d  ",(ulong)uVar1);
  uVar1 = Pla_ManCubeNum(p);
  printf("Cube =%8d  ",(ulong)uVar1);
  uVar1 = Pla_ManLitInNum(p);
  printf("LitIn =%8d  ",(ulong)uVar1);
  uVar1 = Pla_ManLitOutNum(p);
  printf("LitOut =%8d  ",(ulong)uVar1);
  uVar1 = Pla_ManDivNum(p);
  printf("Div =%6d  ",(ulong)uVar1);
  printf("\n");
  return;
}

Assistant:

static inline void Pla_ManPrintStats( Pla_Man_t * p, int fVerbose )
{
    printf( "%-16s :  ",     Pla_ManName(p) );
    printf( "In =%4d  ",     Pla_ManInNum(p) );
    printf( "Out =%4d  ",    Pla_ManOutNum(p) );
    printf( "Cube =%8d  ",   Pla_ManCubeNum(p) );
    printf( "LitIn =%8d  ",  Pla_ManLitInNum(p) );
    printf( "LitOut =%8d  ", Pla_ManLitOutNum(p) );
    printf( "Div =%6d  ",    Pla_ManDivNum(p) );
    printf( "\n" );
}